

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
::iterator::skip_empty_or_deleted(iterator *this)

{
  bool bVar1;
  GroupSse2Impl *in_RDI;
  uint32_t shift;
  GroupSse2Impl local_28;
  uint32_t local_c;
  
  while( true ) {
    bVar1 = IsEmptyOrDeleted(*(ctrl_t *)in_RDI->ctrl[0]);
    if (!bVar1) break;
    GroupSse2Impl::GroupSse2Impl(&local_28,(ctrl_t *)in_RDI->ctrl[0]);
    local_c = GroupSse2Impl::CountLeadingEmptyOrDeleted(in_RDI);
    in_RDI->ctrl[0] = in_RDI->ctrl[0] + (ulong)local_c;
    in_RDI->ctrl[1] = in_RDI->ctrl[1] + (ulong)local_c * 8;
  }
  return;
}

Assistant:

void skip_empty_or_deleted()
				{
					while (IsEmptyOrDeleted(*ctrl_)) {
						// ctrl is not necessarily aligned to Group::kWidth. It is also likely
						// to read past the space for ctrl bytes and into slots. This is ok
						// because ctrl has sizeof() == 1 and slot has sizeof() >= 1 so there
						// is no way to read outside the combined slot array.
						uint32_t shift = Group{ctrl_}.CountLeadingEmptyOrDeleted();
						ctrl_ += shift;
						slot_ += shift;
					}
				}